

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_reporter.cc
# Opt level: O3

bool __thiscall benchmark::ConsoleReporter::ReportContext(ConsoleReporter *this,Context *context)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  this->name_field_width_ = context->name_field_width;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Run on (",8);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,context->num_cpus);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," X ",3);
  poVar3 = std::ostream::_M_insert<double>(context->mhz_per_cpu);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," MHz CPU ",9);
  pcVar1 = ".[\\*^$\n";
  if (1 < context->num_cpus) {
    pcVar1 = "\"%s\": %s";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,pcVar1 + 7,(ulong)(1 < context->num_cpus));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  LocalDateTimeString_abi_cxx11_();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (context->cpu_scaling_enabled == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incure extra overhead.\n"
               ,0x78);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "***WARNING*** Library was built as DEBUG. Timings may be affected.\n",0x43);
  iVar2 = fprintf(_stdout,"%-*s %10s %10s %10s\n",(ulong)(uint)this->name_field_width_,"Benchmark",
                  "Time(ns)","CPU(ns)","Iterations");
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)iVar2 + -1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return true;
}

Assistant:

bool ConsoleReporter::ReportContext(const Context& context) {
  name_field_width_ = context.name_field_width;

  std::cerr << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  std::cerr << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    std::cerr << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incure extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  std::cerr << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif

  int output_width = fprintf(stdout, "%-*s %10s %10s %10s\n",
                             static_cast<int>(name_field_width_), "Benchmark",
                             "Time(ns)", "CPU(ns)", "Iterations");
  std::cout << std::string(output_width - 1, '-') << "\n";

  return true;
}